

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjAddFaninFanout(Acb_Ntk_t *p,int iObj)

{
  int *piVar1;
  Vec_Int_t *p_00;
  long lVar2;
  
  piVar1 = Acb_ObjFanins(p,iObj);
  for (lVar2 = 0; lVar2 < *piVar1; lVar2 = lVar2 + 1) {
    p_00 = Vec_WecEntry(&p->vFanouts,piVar1[lVar2 + 1]);
    Vec_IntPush(p_00,iObj);
  }
  return;
}

Assistant:

static inline void Acb_ObjAddFaninFanout( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins; 
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
}